

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
cmGeneratorTarget::GetLanguageStandardProperty(cmGeneratorTarget *this,string *lang,string *config)

{
  cmTarget *this_00;
  const_iterator cVar1;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar2;
  string key;
  char local_59;
  string local_58;
  string local_38;
  
  cmsys::SystemTools::UpperCase(&local_58,config);
  local_59 = '-';
  cmStrCat<std::__cxx11::string,char,std::__cxx11::string_const&>
            (&local_38,&local_58,&local_59,lang);
  std::__cxx11::string::~string((string *)&local_58);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::find(&(this->LanguageStandardMap)._M_t,&local_38);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = this->Target;
    cmStrCat<std::__cxx11::string_const&,char_const(&)[10]>(&local_58,lang,(char (*) [10])0x7a4724);
    pBVar2 = cmTarget::GetLanguageStandardProperty(this_00,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    pBVar2 = (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(cVar1._M_node + 2);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return pBVar2;
}

Assistant:

BTs<std::string> const* cmGeneratorTarget::GetLanguageStandardProperty(
  std::string const& lang, std::string const& config) const
{
  std::string key = cmStrCat(cmSystemTools::UpperCase(config), '-', lang);
  auto langStandardIter = this->LanguageStandardMap.find(key);
  if (langStandardIter != this->LanguageStandardMap.end()) {
    return &langStandardIter->second;
  }

  return this->Target->GetLanguageStandardProperty(
    cmStrCat(lang, "_STANDARD"));
}